

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O0

int maxClique(CGraphIO *gio,int l_bound,vector<int,_std::allocator<int>_> *max_clique_data)

{
  undefined1 auVar1 [16];
  int iVar2;
  vector<int,_std::allocator<int>_> *ptrVtx;
  ulong uVar3;
  void *pvVar4;
  reference pvVar5;
  int local_88;
  int local_84;
  int j;
  int i;
  int *bitVec;
  int prev_maxClq;
  int maxClq;
  vector<int,_std::allocator<int>_> max_clique_data_inter;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> U;
  vector<int,_std::allocator<int>_> *ptrEdge;
  vector<int,_std::allocator<int>_> *ptrVertex;
  vector<int,_std::allocator<int>_> *max_clique_data_local;
  int l_bound_local;
  CGraphIO *gio_local;
  
  ptrVtx = CGraphIO::GetVerticesPtr(gio);
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)CGraphIO::GetEdgesPtr(gio);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  iVar2 = CGraphIO::GetVertexCount(gio);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&prev_maxClq);
  iVar2 = CGraphIO::GetVertexCount(gio);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&prev_maxClq,(long)iVar2);
  iVar2 = CGraphIO::GetVertexCount(gio);
  std::vector<int,_std::allocator<int>_>::reserve(max_clique_data,(long)iVar2);
  pruned1 = 0;
  pruned2 = 0;
  pruned3 = 0;
  pruned5 = 0;
  bitVec._4_4_ = l_bound;
  iVar2 = CGraphIO::GetVertexCount(gio);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  _j = pvVar4;
  iVar2 = CGraphIO::GetVertexCount(gio);
  memset(pvVar4,0,(long)iVar2 << 2);
  local_84 = CGraphIO::GetVertexCount(gio);
  while (local_84 = local_84 + -1, -1 < local_84) {
    *(undefined4 *)((long)_j + (long)local_84 * 4) = 1;
    bitVec._0_4_ = bitVec._4_4_;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_48);
    iVar2 = getDegree(ptrVtx,local_84);
    if (iVar2 < bitVec._4_4_) {
      pruned1 = pruned1 + 1;
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](ptrVtx,(long)local_84);
      for (local_88 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](ptrVtx,(long)(local_84 + 1)),
          pvVar4 = _j, local_88 < *pvVar5; local_88 = local_88 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_88);
        if (*(int *)((long)pvVar4 + (long)*pvVar5 * 4) == 1) {
          pruned2 = pruned2 + 1;
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)local_88);
          iVar2 = getDegree(ptrVtx,*pvVar5);
          if (iVar2 < bitVec._4_4_) {
            pruned3 = pruned3 + 1;
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)local_88);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_48,pvVar5);
          }
        }
      }
      maxCliqueHelper(gio,(vector<int,_std::allocator<int>_> *)local_48,1,(int *)((long)&bitVec + 4)
                      ,(vector<int,_std::allocator<int>_> *)&prev_maxClq);
      if ((int)bitVec < bitVec._4_4_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&prev_maxClq,&local_84);
        std::vector<int,_std::allocator<int>_>::operator=
                  (max_clique_data,(vector<int,_std::allocator<int>_> *)&prev_maxClq);
      }
      std::vector<int,_std::allocator<int>_>::clear
                ((vector<int,_std::allocator<int>_> *)&prev_maxClq);
    }
  }
  if (_j != (void *)0x0) {
    operator_delete__(_j);
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&prev_maxClq);
  iVar2 = bitVec._4_4_;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&prev_maxClq)
  ;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return iVar2;
}

Assistant:

int maxClique( CGraphIO& gio, int l_bound, vector<int>& max_clique_data )
{
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U;
   	U.reserve(gio.GetVertexCount());
   	vector<int> max_clique_data_inter;
   	max_clique_data_inter.reserve(gio.GetVertexCount());
   	max_clique_data.reserve(gio.GetVertexCount());
	int maxClq = l_bound;
   	int prev_maxClq;

	pruned1 = 0;
	pruned2 = 0;
	pruned3 = 0;
	pruned5 = 0;

	//Bit Vector to track if vertex has been considered previously.
	int *bitVec = new int[gio.GetVertexCount()];
	memset(bitVec, 0, gio.GetVertexCount() * sizeof(int));

	for(int i = gio.GetVertexCount()-1; i >= 0; i--)
	{
		bitVec[i] = 1;
      prev_maxClq = maxClq;

		U.clear();
		//Pruning 1
		if( getDegree(ptrVertex, i) < maxClq)
		{
			pruned1++;
			continue;
		}

		for( int j = (*ptrVertex)[i]; j < (*ptrVertex)[i + 1]; j++ )
		{	
			//Pruning 2
			if(bitVec[(*ptrEdge)[j]] != 1)
			{
				//Pruning 3
				if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )			
					U.push_back((*ptrEdge)[j]);
				else
					pruned3++;
			}
			else 
				pruned2++;
		}

		maxCliqueHelper( gio, &U, 1, maxClq, max_clique_data_inter );

      if(maxClq > prev_maxClq)
      {
         max_clique_data_inter.push_back(i);
         max_clique_data = max_clique_data_inter;
		}
		max_clique_data_inter.clear();
	}

   delete [] bitVec;
   max_clique_data_inter.clear();

#ifdef _DEBUG
	cout << "Pruning 1 = " << pruned1 << endl;
	cout << "Pruning 2 = " << pruned2 << endl;
	cout << "Pruning 3 = " << pruned3 << endl;
	cout << "Pruning 5 = " << pruned5 << endl;
#endif

		return maxClq;
}